

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O2

void rengine::rengine_fractalTexture(uint *bits,vec2 size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int ix;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_48;
  float fStack_44;
  
  iVar2 = rand();
  iVar3 = rand();
  iVar4 = rand();
  iVar5 = rand();
  iVar6 = rand();
  local_48 = size.x;
  fStack_44 = size.y;
  uVar7 = (uint)local_48;
  iVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
  }
  iVar1 = (int)fStack_44;
  if ((int)fStack_44 < 1) {
    iVar1 = iVar8;
  }
  do {
    if (iVar8 == iVar1) {
      return;
    }
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      fVar16 = (float)(int)uVar10 / (float)(int)local_48 + -0.5;
      fVar16 = fVar16 + fVar16;
      fVar18 = ((float)iVar8 / (float)(int)fStack_44 + -0.5) * 3.0;
      for (iVar11 = 0; iVar11 != 0x32; iVar11 = iVar11 + 1) {
        fVar17 = fVar18 * fVar16;
        fVar16 = (fVar16 * fVar16 - fVar18 * fVar18) + (float)(iVar6 % 100) / 100.0;
        fVar18 = fVar17 + fVar17 + (float)(iVar5 % 100) / 100.0;
        if (4.0 < fVar16 * fVar16 + fVar18 * fVar18) break;
      }
      fVar16 = (float)((uint)(((float)iVar11 / 50.0) * 3.0) & -(uint)((float)iVar11 / 50.0 < 1.0));
      uVar12 = (uint)(long)(fVar16 * 255.0);
      if (0xfe < uVar12) {
        uVar12 = 0xff;
      }
      uVar13 = (uint)(long)(fVar16 * (float)((long)iVar2 % 0x100 & 0xffffffff));
      if (0xfe < uVar13) {
        uVar13 = 0xff;
      }
      uVar14 = (uint)(long)(fVar16 * (float)((long)iVar3 % 0x100 & 0xffffffff));
      if (0xfe < uVar14) {
        uVar14 = 0xff;
      }
      uVar15 = (uint)(long)(fVar16 * (float)((long)iVar4 % 0x100 & 0xffffffff));
      if (0xfe < uVar15) {
        uVar15 = 0xff;
      }
      bits[iVar8 * uVar7 + (int)uVar10] = uVar14 << 8 | uVar15 << 0x10 | uVar13 | uVar12 << 0x18;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

inline void rengine_fractalTexture(unsigned *bits, vec2 size)
{
    unsigned r = rand() % 256;
    unsigned g = rand() % 256;
    unsigned b = rand() % 256;

    float cy = (rand() % 100) / 100.0;
    float cx = (rand() % 100) / 100.0;
    int iter = 50;

    int w = size.x;
    int h = size.y;
    unsigned stride = w;

    for (int iy=0; iy<h; ++iy) {
        float ty = iy / (float) h;
        for (int ix=0; ix<w; ++ix) {
            float tx = ix / (float) w;

            float zx = 2.0 * (tx - 0.5);
            float zy = 3.0 * (ty - 0.5);
            int i = 0;
            for (i=0; i<iter; ++i) {
                float x = (zx * zx - zy * zy) + cx;
                float y = (zy * zx + zx * zy) + cy;

                if (x*x + y*y > 4.0) break;
                zx = x;
                zy = y;
            }

            float fv = i / float(iter);
            if (fv >= 1.0f)
                fv = 0.0f;
            fv = fv * 3.0f;

            unsigned pa = std::min<unsigned>(255, (fv * 255));
            unsigned pr = std::min<unsigned>(255, (fv * r));
            unsigned pg = std::min<unsigned>(255, (fv * g));
            unsigned pb = std::min<unsigned>(255, (fv * b));
            bits[ix + iy * stride] = (pa << 24) | (pb << 16) | (pg << 8) | (pr);
        }
    }
}